

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

void __thiscall
ChainstateManager::ReceivedBlockTransactions
          (ChainstateManager *this,CBlock *block,CBlockIndex *pindexNew,FlatFilePos *pos)

{
  multimap<CBlockIndex_*,_CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>_>
  *this_00;
  int iVar1;
  long lVar2;
  CBlockIndex *pCVar3;
  uint uVar4;
  undefined8 *puVar5;
  bool bVar6;
  ulong uVar7;
  CBlockIndex *pCVar8;
  ulong uVar9;
  _Base_ptr p_Var10;
  uint64_t uVar11;
  char (*args_3) [13];
  undefined8 *puVar12;
  _Self __tmp;
  _Rb_tree_iterator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_> __position;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  pair<std::_Rb_tree_iterator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>,_std::_Rb_tree_iterator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>_>
  pVar13;
  unsigned_long *puVar14;
  char (*in_stack_ffffffffffffff40) [13];
  CBlockIndex *pindex;
  CBlockIndex *pindexNew_local;
  undefined8 *local_a8;
  undefined8 *local_a0;
  deque<CBlockIndex_*,_std::allocator<CBlockIndex_*>_> queue;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar7 = (ulong)((long)(block->vtx).
                        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(block->vtx).
                       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 4;
  pindexNew->nTx = (uint)uVar7;
  pindexNew_local = pindexNew;
  if (pindexNew->m_chain_tx_count != 0) {
    if (pindexNew->pprev == (CBlockIndex *)0x0) {
      uVar11 = 0;
    }
    else {
      uVar11 = pindexNew->pprev->m_chain_tx_count;
    }
    if ((pindexNew->m_chain_tx_count != (uVar7 & 0xffffffff) + uVar11) &&
       (pCVar8 = GetSnapshotBaseBlock(this), pCVar8 != pindexNew)) {
      if (pindexNew->pprev == (CBlockIndex *)0x0) {
        uVar11 = 0;
      }
      else {
        uVar11 = pindexNew->pprev->m_chain_tx_count;
      }
      local_a8 = (undefined8 *)(uVar11 + pindexNew->nTx);
      puVar14 = (unsigned_long *)0x8c25ec;
      FormatFullVersion_abi_cxx11_();
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
      ;
      source_file._M_len = 0x57;
      logging_function._M_str = "ReceivedBlockTransactions";
      logging_function._M_len = 0x19;
      LogPrintf_<int,unsigned_long,unsigned_long,char[13],std::__cxx11::string,char[42]>
                (logging_function,source_file,0xf13,(LogFlags)&pindexNew->nHeight,
                 (int)pindexNew + 0x50,(char *)&local_a8,(int *)&queue,puVar14,(unsigned_long *)this
                 ,in_stack_ffffffffffffff40,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pindex,
                 (char (*) [42])pindexNew_local);
      std::__cxx11::string::~string((string *)&queue);
      pindexNew_local->m_chain_tx_count = 0;
      pindexNew = pindexNew_local;
    }
  }
  uVar4 = pos->nPos;
  pindexNew->nFile = pos->nFile;
  pindexNew->nDataPos = uVar4;
  pindexNew->nUndoPos = 0;
  *(byte *)&pindexNew->nStatus = (byte)pindexNew->nStatus | 8;
  bVar6 = DeploymentActiveAt<Consensus::BuriedDeployment>(pindexNew,this,DEPLOYMENT_SEGWIT);
  if (bVar6) {
    *(byte *)&pindexNew_local->nStatus = (byte)pindexNew_local->nStatus | 0x80;
  }
  CBlockIndex::RaiseValidity(pindexNew_local,BLOCK_VALID_TRANSACTIONS);
  std::
  _Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
  ::_M_insert_unique<CBlockIndex*const&>
            ((_Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
              *)&(this->m_blockman).m_dirty_blockindex,&pindexNew_local);
  pCVar8 = pindexNew_local->pprev;
  if ((pCVar8 == (CBlockIndex *)0x0) || (pCVar8->m_chain_tx_count != 0)) {
    std::_Deque_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>::_Deque_base
              (&queue.super__Deque_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>);
    std::deque<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>::push_back
              ((deque<CBlockIndex_*,_std::allocator<CBlockIndex_*>_> *)
               &queue.super__Deque_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>,
               &pindexNew_local);
    this_00 = &(this->m_blockman).m_blocks_unlinked;
    while (queue.super__Deque_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur !=
           queue.super__Deque_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur) {
      pindex = *queue.super__Deque_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur;
      std::deque<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>::pop_front(&queue);
      pCVar8 = pindex;
      uVar7 = pindex->m_chain_tx_count;
      if (uVar7 != 0) {
        uVar9 = (ulong)pindex->nTx;
        pCVar3 = pindex->pprev;
        if (pCVar3 == (CBlockIndex *)0x0) {
          if (uVar7 != uVar9) {
            uVar11 = 0;
            goto LAB_008c2717;
          }
        }
        else if (uVar7 != pCVar3->m_chain_tx_count + uVar9) {
          uVar11 = pCVar3->m_chain_tx_count;
LAB_008c2717:
          args_3 = (char (*) [13])(uVar11 + uVar9);
          puVar14 = (unsigned_long *)0x8c2727;
          FormatFullVersion_abi_cxx11_();
          source_file_00._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
          ;
          source_file_00._M_len = 0x57;
          logging_function_00._M_str = "ReceivedBlockTransactions";
          logging_function_00._M_len = 0x19;
          LogPrintf_<int,unsigned_long,unsigned_long,char[13],std::__cxx11::string,char[42]>
                    (logging_function_00,source_file_00,0xf2f,(LogFlags)&pCVar8->nHeight,
                     (int)pCVar8 + 0x50,&stack0xffffffffffffff40,(int *)&local_a8,puVar14,
                     (unsigned_long *)this,args_3,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pindex,
                     (char (*) [42])pindexNew_local);
          std::__cxx11::string::~string((string *)&local_a8);
        }
      }
      if (pindex->pprev == (CBlockIndex *)0x0) {
        uVar11 = 0;
      }
      else {
        uVar11 = pindex->pprev->m_chain_tx_count;
      }
      pindex->m_chain_tx_count = pindex->nTx + uVar11;
      iVar1 = this->nBlockSequenceId;
      this->nBlockSequenceId = iVar1 + 1;
      pindex->nSequenceId = iVar1;
      GetAll((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)&local_a8,this);
      puVar5 = local_a0;
      for (puVar12 = local_a8; puVar12 != puVar5; puVar12 = puVar12 + 1) {
        Chainstate::TryAddBlockIndexCandidate((Chainstate *)*puVar12,pindex);
      }
      std::_Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>::~_Vector_base
                ((_Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_> *)&local_a8);
      pVar13 = std::
               _Rb_tree<CBlockIndex_*,_std::pair<CBlockIndex_*const,_CBlockIndex_*>,_std::_Select1st<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>,_std::less<CBlockIndex_*>,_std::allocator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>_>
               ::equal_range(&this_00->_M_t,&pindex);
      __position._M_node = pVar13.first._M_node._M_node;
      while (__position._M_node != pVar13.second._M_node._M_node) {
        std::deque<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>::push_back
                  (&queue,(value_type *)&__position._M_node[1]._M_parent);
        p_Var10 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
        std::
        _Rb_tree<CBlockIndex*,std::pair<CBlockIndex*const,CBlockIndex*>,std::_Select1st<std::pair<CBlockIndex*const,CBlockIndex*>>,std::less<CBlockIndex*>,std::allocator<std::pair<CBlockIndex*const,CBlockIndex*>>>
        ::erase_abi_cxx11_((_Rb_tree<CBlockIndex*,std::pair<CBlockIndex*const,CBlockIndex*>,std::_Select1st<std::pair<CBlockIndex*const,CBlockIndex*>>,std::less<CBlockIndex*>,std::allocator<std::pair<CBlockIndex*const,CBlockIndex*>>>
                            *)this_00,(iterator)__position._M_node);
        __position._M_node = p_Var10;
      }
    }
    std::_Deque_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>::~_Deque_base
              (&queue.super__Deque_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>);
  }
  else if ((pCVar8->nStatus & 6) != 0 && (pCVar8->nStatus & 0x60) == 0) {
    queue.super__Deque_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
    super__Deque_impl_data._M_map_size = (size_t)pindexNew_local;
    queue.super__Deque_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
    super__Deque_impl_data._M_map = (_Map_pointer)pCVar8;
    std::
    _Rb_tree<CBlockIndex*,std::pair<CBlockIndex*const,CBlockIndex*>,std::_Select1st<std::pair<CBlockIndex*const,CBlockIndex*>>,std::less<CBlockIndex*>,std::allocator<std::pair<CBlockIndex*const,CBlockIndex*>>>
    ::_M_emplace_equal<std::pair<CBlockIndex*,CBlockIndex*>>
              ((_Rb_tree<CBlockIndex*,std::pair<CBlockIndex*const,CBlockIndex*>,std::_Select1st<std::pair<CBlockIndex*const,CBlockIndex*>>,std::less<CBlockIndex*>,std::allocator<std::pair<CBlockIndex*const,CBlockIndex*>>>
                *)&(this->m_blockman).m_blocks_unlinked,(pair<CBlockIndex_*,_CBlockIndex_*> *)&queue
              );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ChainstateManager::ReceivedBlockTransactions(const CBlock& block, CBlockIndex* pindexNew, const FlatFilePos& pos)
{
    AssertLockHeld(cs_main);
    pindexNew->nTx = block.vtx.size();
    // Typically m_chain_tx_count will be 0 at this point, but it can be nonzero if this
    // is a pruned block which is being downloaded again, or if this is an
    // assumeutxo snapshot block which has a hardcoded m_chain_tx_count value from the
    // snapshot metadata. If the pindex is not the snapshot block and the
    // m_chain_tx_count value is not zero, assert that value is actually correct.
    auto prev_tx_sum = [](CBlockIndex& block) { return block.nTx + (block.pprev ? block.pprev->m_chain_tx_count : 0); };
    if (!Assume(pindexNew->m_chain_tx_count == 0 || pindexNew->m_chain_tx_count == prev_tx_sum(*pindexNew) ||
                pindexNew == GetSnapshotBaseBlock())) {
        LogWarning("Internal bug detected: block %d has unexpected m_chain_tx_count %i that should be %i (%s %s). Please report this issue here: %s\n",
            pindexNew->nHeight, pindexNew->m_chain_tx_count, prev_tx_sum(*pindexNew), PACKAGE_NAME, FormatFullVersion(), PACKAGE_BUGREPORT);
        pindexNew->m_chain_tx_count = 0;
    }
    pindexNew->nFile = pos.nFile;
    pindexNew->nDataPos = pos.nPos;
    pindexNew->nUndoPos = 0;
    pindexNew->nStatus |= BLOCK_HAVE_DATA;
    if (DeploymentActiveAt(*pindexNew, *this, Consensus::DEPLOYMENT_SEGWIT)) {
        pindexNew->nStatus |= BLOCK_OPT_WITNESS;
    }
    pindexNew->RaiseValidity(BLOCK_VALID_TRANSACTIONS);
    m_blockman.m_dirty_blockindex.insert(pindexNew);

    if (pindexNew->pprev == nullptr || pindexNew->pprev->HaveNumChainTxs()) {
        // If pindexNew is the genesis block or all parents are BLOCK_VALID_TRANSACTIONS.
        std::deque<CBlockIndex*> queue;
        queue.push_back(pindexNew);

        // Recursively process any descendant blocks that now may be eligible to be connected.
        while (!queue.empty()) {
            CBlockIndex *pindex = queue.front();
            queue.pop_front();
            // Before setting m_chain_tx_count, assert that it is 0 or already set to
            // the correct value. This assert will fail after receiving the
            // assumeutxo snapshot block if assumeutxo snapshot metadata has an
            // incorrect hardcoded AssumeutxoData::m_chain_tx_count value.
            if (!Assume(pindex->m_chain_tx_count == 0 || pindex->m_chain_tx_count == prev_tx_sum(*pindex))) {
                LogWarning("Internal bug detected: block %d has unexpected m_chain_tx_count %i that should be %i (%s %s). Please report this issue here: %s\n",
                   pindex->nHeight, pindex->m_chain_tx_count, prev_tx_sum(*pindex), PACKAGE_NAME, FormatFullVersion(), PACKAGE_BUGREPORT);
            }
            pindex->m_chain_tx_count = prev_tx_sum(*pindex);
            pindex->nSequenceId = nBlockSequenceId++;
            for (Chainstate *c : GetAll()) {
                c->TryAddBlockIndexCandidate(pindex);
            }
            std::pair<std::multimap<CBlockIndex*, CBlockIndex*>::iterator, std::multimap<CBlockIndex*, CBlockIndex*>::iterator> range = m_blockman.m_blocks_unlinked.equal_range(pindex);
            while (range.first != range.second) {
                std::multimap<CBlockIndex*, CBlockIndex*>::iterator it = range.first;
                queue.push_back(it->second);
                range.first++;
                m_blockman.m_blocks_unlinked.erase(it);
            }
        }
    } else {
        if (pindexNew->pprev && pindexNew->pprev->IsValid(BLOCK_VALID_TREE)) {
            m_blockman.m_blocks_unlinked.insert(std::make_pair(pindexNew->pprev, pindexNew));
        }
    }
}